

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# platform.c
# Opt level: O0

int linux_eventfd_raise(eventfd *efd)

{
  ssize_t sVar1;
  int *piVar2;
  int *in_RDI;
  int rv;
  uint64_t counter;
  int local_14;
  undefined8 local_10 [2];
  
  local_14 = 0;
  local_10[0] = 1;
  sVar1 = write(*in_RDI,local_10,8);
  if (sVar1 < 0) {
    piVar2 = __errno_location();
    if (*piVar2 == 4) {
      local_14 = -4;
    }
    else if (*piVar2 != 0xb) {
      local_14 = -1;
    }
  }
  return local_14;
}

Assistant:

static int
linux_eventfd_raise(struct eventfd *efd)
{
    uint64_t counter;
    int rv = 0;

    dbg_printf("eventfd=%i - raising event level", efd->ef_id);
    counter = 1;
    if (write(efd->ef_id, &counter, sizeof(counter)) < 0) {
        switch (errno) {
        case EAGAIN:
            /* Not considered an error */
            break;

        case EINTR:
            rv = -EINTR;
            break;

        default:
            dbg_printf("write(2): %s", strerror(errno));
            rv = -1;
        }
    }
    return (rv);
}